

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

void __thiscall Map::Attack(Map *this,Character *from,Direction direction)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  int iVar3;
  World *pWVar4;
  Character *other;
  pointer ppNVar5;
  double dVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  EIF_Data *pEVar11;
  EIF_Data *pEVar12;
  mapped_type *pmVar13;
  ENF_Data *pEVar14;
  mapped_type *pmVar15;
  Map *this_00;
  _List_node_base *p_Var16;
  pointer ppNVar17;
  NPC *this_01;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  NPC *pNVar18;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  formula_vars;
  PacketBuilder builder;
  key_type local_160;
  double local_140;
  NPC *local_138;
  int local_12c;
  undefined1 local_128 [32];
  float local_108;
  size_t local_100;
  __node_base_ptr p_Stack_f8;
  Map *local_f0;
  int local_e4;
  key_type local_e0;
  key_type local_c0;
  string local_a0;
  string local_80;
  PacketBuilder local_60;
  
  pEVar11 = EIF::Get(this->world->eif,(from->paperdoll)._M_elems[8]);
  pEVar12 = EIF::Get(this->world->eif,(from->paperdoll)._M_elems[7]);
  if ((pEVar11->subtype == Ranged) && (pEVar12->subtype != Arrows)) {
    if (pEVar11->id != 0x16d) {
      return;
    }
    iVar9 = std::__cxx11::string::compare((char *)&pEVar11->name);
    if (iVar9 != 0) {
      return;
    }
  }
  from->direction = direction;
  from->attacks = from->attacks + 1;
  Character::CancelSpell(from);
  if (from->arena != (Arena *)0x0) {
    Arena::Attack(from->arena,from,direction);
  }
  if ((pEVar11->field_25).scrollmap == 0) {
LAB_001725a7:
    if (this->pk == false) {
      pWVar4 = this->world;
      local_128._0_8_ = local_128 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"GlobalPK","");
      pmVar13 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&pWVar4->config,(key_type *)local_128);
      bVar8 = util::variant::GetBool(pmVar13);
      if (bVar8) {
        bVar8 = World::PKExcept(this->world,(int)this->id);
        bVar8 = !bVar8;
      }
      else {
        bVar8 = false;
      }
      if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
        operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
      }
      if (!bVar8) {
        bVar8 = false;
        goto LAB_00172645;
      }
    }
    bVar8 = false;
    bVar7 = AttackPK(this,from,DIRECTION_DOWN);
    if (bVar7) {
      return;
    }
  }
  else {
    bVar7 = World::IsInstrument(this->world,(pEVar11->field_25).scrollmap);
    bVar8 = true;
    if (!bVar7) goto LAB_001725a7;
  }
LAB_00172645:
  PacketBuilder::PacketBuilder(&local_60,PACKET_ATTACK,PACKET_PLAYER,3);
  iVar9 = Character::PlayerID(from);
  PacketBuilder::AddShort(&local_60,iVar9);
  PacketBuilder::AddChar(&local_60,(uint)direction);
  p_Var16 = (this->characters).super__List_base<Character_*,_std::allocator<Character_*>_>._M_impl.
            _M_node.super__List_node_base._M_next;
  local_f0 = this;
  if (p_Var16 != (_List_node_base *)&this->characters) {
    do {
      other = (Character *)p_Var16[1]._M_next;
      if ((other != from) && (bVar7 = Character::InRange(from,other), bVar7)) {
        Character::Send(other,&local_60);
      }
      p_Var16 = p_Var16->_M_next;
    } while (p_Var16 != (_List_node_base *)&this->characters);
  }
  this_00 = local_f0;
  if ((!bVar8) && ((from->nointeract & 4) == 0)) {
    uVar2 = (uint)from->x;
    local_140 = (double)CONCAT44(local_140._4_4_,(uint)from->y);
    local_12c = 1;
    if (pEVar11->subtype == Ranged) {
      pWVar4 = local_f0->world;
      local_128._0_8_ = local_128 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"RangedDistance","");
      pmVar13 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&pWVar4->config,(key_type *)local_128);
      local_12c = util::variant::GetInt(pmVar13);
      if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
        operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
      }
      if (local_12c < 1) goto LAB_00172de4;
    }
    iVar9 = 0;
    do {
      switch(from->direction) {
      case DIRECTION_DOWN:
        local_140 = (double)CONCAT44(local_140._4_4_,local_140._0_4_ + 1);
        break;
      case DIRECTION_LEFT:
        uVar2 = uVar2 - 1;
        break;
      case DIRECTION_UP:
        local_140 = (double)CONCAT44(local_140._4_4_,local_140._0_4_ + -1);
        break;
      case DIRECTION_RIGHT:
        uVar2 = uVar2 + 1;
      }
      ppNVar5 = (this_00->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_e4 = iVar9;
      for (ppNVar17 = (this_00->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppNVar17 != ppNVar5; ppNVar17 = ppNVar17 + 1
          ) {
        this_01 = *ppNVar17;
        pEVar14 = NPC::ENF(this_01);
        if ((pEVar14->type == Passive) || (pEVar14 = NPC::ENF(this_01), pEVar14->type == Aggressive)
           ) {
          bVar8 = false;
LAB_001727e7:
          if ((this_01->alive == true) && (uVar2 == this_01->x)) {
            bVar7 = local_140._0_4_ == this_01->y;
            if (bVar8) goto LAB_001728ad;
            if (local_140._0_4_ != this_01->y) goto LAB_001728d7;
            goto LAB_0017291c;
          }
          if (bVar8) goto LAB_001728aa;
        }
        else {
          uVar10 = (*(from->super_Command_Source)._vptr_Command_Source[1])(from);
          pWVar4 = this_00->world;
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          local_138 = this_01;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"killnpc","");
          pmVar13 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&pWVar4->admin_config,&local_e0);
          iVar9 = util::variant::GetInt(pmVar13);
          bVar8 = true;
          this_00 = local_f0;
          this_01 = local_138;
          if (iVar9 <= (int)(uVar10 & 0xff)) goto LAB_001727e7;
LAB_001728aa:
          bVar7 = false;
LAB_001728ad:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          if (bVar7) {
LAB_0017291c:
            iVar9 = util::rand();
            util::rand();
            bVar8 = true;
            if ((((uint)this_01->direction - (uint)from->direction) + 2 & 0xfffffffb) == 0) {
              pWVar4 = this_00->world;
              local_128._0_8_ = local_128 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"CriticalRate","")
              ;
              pmVar13 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&pWVar4->config,(key_type *)local_128);
              dVar6 = util::variant::GetFloat(pmVar13);
              bVar8 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) < dVar6;
              if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
                operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
              }
            }
            local_138 = (NPC *)CONCAT44(local_138._4_4_,iVar9);
            pWVar4 = this_00->world;
            local_128._0_8_ = local_128 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_128,"CriticalFirstHit","");
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&pWVar4->config,(key_type *)local_128);
            bVar7 = util::variant::GetBool(pmVar13);
            if (bVar7) {
              iVar9 = this_01->hp;
              pEVar14 = NPC::ENF(this_01);
              iVar3 = pEVar14->hp;
              if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
                operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
              }
              bVar8 = (bool)(bVar8 | iVar9 == iVar3);
            }
            else if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
              operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
            }
            local_128._0_8_ = &p_Stack_f8;
            local_128._8_8_ = 1;
            local_128._16_8_ = 0;
            local_128._24_8_ = 0;
            local_108 = 1.0;
            local_100 = 0;
            p_Stack_f8 = (__node_base_ptr)0x0;
            local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
            Character::FormulaVars
                      (from,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                             *)local_128,&local_80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"target_","");
            NPC::FormulaVars(this_01,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                      *)local_128,&local_a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            pWVar4 = this_00->world;
            paVar1 = &local_160.field_2;
            local_160._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"MobRate","");
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&pWVar4->config,&local_160);
            local_140 = util::variant::GetFloat(pmVar13);
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"modifier","");
            pmVar15 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_128,&local_c0);
            *pmVar15 = local_140;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            iVar9 = (int)local_138;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != paVar1) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
            local_160._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"damage","");
            pmVar15 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_128,&local_160);
            *pmVar15 = (double)iVar9;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != paVar1) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
            local_160._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"critical","");
            pmVar15 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_128,&local_160);
            *pmVar15 = (double)bVar8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != paVar1) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
            pWVar4 = local_f0->world;
            local_160._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"damage","");
            local_138 = (NPC *)World::EvalFormula(pWVar4,&local_160,
                                                  (
                                                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                                  *)local_128);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != paVar1) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
            pWVar4 = local_f0->world;
            local_160._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"hit_rate","");
            pNVar18 = (NPC *)World::EvalFormula(pWVar4,&local_160,
                                                (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                                 *)local_128);
            iVar9 = (int)(double)local_138;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != paVar1) {
              local_138 = pNVar18;
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
              pNVar18 = local_138;
            }
            if (iVar9 < 1) {
              iVar9 = 0;
            }
            if ((double)pNVar18 < (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da)) {
              iVar9 = 0;
            }
            iVar3 = this_01->hp;
            if (iVar9 <= this_01->hp) {
              iVar3 = iVar9;
            }
            pWVar4 = local_f0->world;
            local_160._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"LimitDamage","");
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&pWVar4->config,&local_160);
            bVar8 = util::variant::GetBool(pmVar13);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != paVar1) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
            if (bVar8) {
              iVar9 = iVar3;
            }
            NPC::Damage(this_01,from,iVar9,-1);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)local_128);
            goto LAB_00172de4;
          }
        }
LAB_001728d7:
      }
      bVar8 = Walkable(this_00,(uchar)uVar2,SUB81(local_140,0),true);
      iVar9 = local_e4 + 1;
    } while (bVar8 && iVar9 != local_12c);
  }
LAB_00172de4:
  PacketBuilder::~PacketBuilder(&local_60);
  return;
}

Assistant:

void Map::Attack(Character *from, Direction direction)
{
	const EIF_Data& wepdata = this->world->eif->Get(from->paperdoll[Character::Weapon]);
	const EIF_Data& shielddata = this->world->eif->Get(from->paperdoll[Character::Shield]);

	if (wepdata.subtype == EIF::Ranged && shielddata.subtype != EIF::Arrows)
	{
		// Ranged gun hack
		if (wepdata.id != 365 || wepdata.name != "Gun")
		{
			return;
		}
		// / Ranged gun hack
	}

	from->direction = direction;
	from->attacks += 1;

	from->CancelSpell();

	if (from->arena)
	{
		from->arena->Attack(from, direction);
	}

	int wep_graphic = wepdata.dollgraphic;
	bool is_instrument = (wep_graphic != 0 && this->world->IsInstrument(wep_graphic));

	if (!is_instrument && (this->pk || (this->world->config["GlobalPK"] && !this->world->PKExcept(this->id))))
	{
		if (this->AttackPK(from, direction))
		{
			return;
		}
	}

	PacketBuilder builder(PACKET_ATTACK, PACKET_PLAYER, 3);
	builder.AddShort(from->PlayerID());
	builder.AddChar(direction);

	UTIL_FOREACH(this->characters, character)
	{
		if (character == from || !from->InRange(character))
		{
			continue;
		}

		character->Send(builder);
	}

	if (is_instrument)
		return;

	if (!from->CanInteractCombat())
		return;

	int target_x = from->x;
	int target_y = from->y;

	int range = 1;

	if (wepdata.subtype == EIF::Ranged)
	{
		range = static_cast<int>(this->world->config["RangedDistance"]);
	}

	for (int i = 0; i < range; ++i)
	{
		switch (from->direction)
		{
			case DIRECTION_UP:
				target_y -= 1;
				break;

			case DIRECTION_RIGHT:
				target_x += 1;
				break;

			case DIRECTION_DOWN:
				target_y += 1;
				break;

			case DIRECTION_LEFT:
				target_x -= 1;
				break;
		}

		UTIL_FOREACH(this->npcs, npc)
		{
			if ((npc->ENF().type == ENF::Passive || npc->ENF().type == ENF::Aggressive || from->SourceDutyAccess() >= static_cast<int>(this->world->admin_config["killnpc"]))
			 && npc->alive && npc->x == target_x && npc->y == target_y)
			{
				int amount = util::rand(from->mindam, from->maxdam);
				double rand = util::rand(0.0, 1.0);
				// Checks if target is facing you
				bool critical = std::abs(int(npc->direction) - from->direction) != 2 || rand < static_cast<double>(this->world->config["CriticalRate"]);

				if (this->world->config["CriticalFirstHit"] && npc->hp == npc->ENF().hp)
					critical = true;

				std::unordered_map<std::string, double> formula_vars;

				from->FormulaVars(formula_vars);
				npc->FormulaVars(formula_vars, "target_");
				formula_vars["modifier"] = this->world->config["MobRate"];
				formula_vars["damage"] = amount;
				formula_vars["critical"] = critical;

				amount = this->world->EvalFormula("damage", formula_vars);
				double hit_rate = this->world->EvalFormula("hit_rate", formula_vars);

				if (rand > hit_rate)
				{
					amount = 0;
				}

				amount = std::max(amount, 0);

				int limitamount = std::min(amount, int(npc->hp));

				if (this->world->config["LimitDamage"])
				{
					amount = limitamount;
				}

				npc->Damage(from, amount);
				// *npc may not be valid here

				return;
			}
		}

		if (!this->Walkable(target_x, target_y, true))
		{
			return;
		}
	}
}